

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

QVariant * QVariant::moveConstruct(QVariant *__return_storage_ptr__,QMetaType type,void *data)

{
  undefined1 *puVar1;
  _Head_base<0UL,_QVariant::PrivateShared_*,_false> _Var2;
  bool bVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  _Head_base<0UL,_QVariant::PrivateShared_*,_false> local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(ulong *)&(__return_storage_ptr__->d).field_0x18 = (ulong)type.d_ptr & 0xfffffffffffffffc;
  if (data == (void *)0x0) {
    uVar4 = 2;
  }
  else {
    uVar4 = (ulong)((uint)(((type.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i == 0x33) *
                   2);
  }
  uVar4 = uVar4 | (ulong)type.d_ptr & 0xfffffffffffffffc;
  *(ulong *)&(__return_storage_ptr__->d).field_0x18 = uVar4;
  bVar3 = Private::canUseInternalSpace(type.d_ptr);
  if (bVar3) {
    *(ulong *)&(__return_storage_ptr__->d).field_0x18 = uVar4;
    if ((data != (void *)0x0) || ((type.d_ptr)->defaultCtr != (DefaultCtrFn)0x0)) {
      QtMetaTypePrivate::moveConstruct(type.d_ptr,__return_storage_ptr__,data);
    }
  }
  else {
    local_30._M_head_impl = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    customConstructSharedImpl((size_t)&local_30,(ulong)(type.d_ptr)->size);
    QtMetaTypePrivate::moveConstruct
              (type.d_ptr,
               (undefined1 *)
               ((long)&((local_30._M_head_impl)->ref).super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i +
               (long)(local_30._M_head_impl)->offset),data);
    _Var2._M_head_impl = local_30._M_head_impl;
    local_30._M_head_impl = (PrivateShared *)0x0;
    std::unique_ptr<QVariant::PrivateShared,_Deleter>::~unique_ptr
              ((unique_ptr<QVariant::PrivateShared,_Deleter> *)&local_30);
    (__return_storage_ptr__->d).data.shared = _Var2._M_head_impl;
    puVar1 = &(__return_storage_ptr__->d).field_0x18;
    *puVar1 = *puVar1 | 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QVariant::moveConstruct(QMetaType type, void *data)
{
    QVariant var;
    var.d = QVariant::Private(type.d_ptr);
    customConstruct<ForceMove, NonNull>(type.d_ptr, &var.d, data);
    return var;
}